

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O1

void __thiscall
bssl::gtest_suite_PkitsTest08CertificatePolicies_::
Section8DifferentPoliciesTest3Subpart1<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::
TestBody(Section8DifferentPoliciesTest3Subpart1<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
         *this)

{
  PkitsTestInfo *in_RCX;
  PkitsTestInfo info;
  PkitsTestInfo local_88;
  
  PkitsTestInfo::PkitsTestInfo(&local_88);
  local_88.test_number = "4.8.3";
  local_88.should_validate = true;
  PkitsTestInfo::SetUserConstrainedPolicySet(&local_88,"");
  PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::RunTest<4ul,3ul>
            ((PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate> *)
             &PTR_anon_var_dwarf_3fc32f_006ca5f0,(char *(*) [4])&PTR_anon_var_dwarf_3fc361_006ca610,
             &local_88.test_number,in_RCX);
  PkitsTestInfo::~PkitsTestInfo(&local_88);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest08CertificatePolicies,
                     Section8DifferentPoliciesTest3Subpart1) {
  const char* const certs[] = {"TrustAnchorRootCertificate", "GoodCACert",
                               "PoliciesP2subCACert",
                               "DifferentPoliciesTest3EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "GoodCACRL",
                              "PoliciesP2subCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.8.3";
  info.should_validate = true;
  info.SetUserConstrainedPolicySet("");

  this->RunTest(certs, crls, info);
}